

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  Mat *this_00;
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint _c;
  undefined4 uVar13;
  _func_int *p_Var14;
  size_t sVar15;
  void *pvVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  undefined4 *puVar20;
  int iVar21;
  void *pvVar22;
  int iVar23;
  ulong uVar24;
  int k;
  ulong uVar25;
  ulong uVar26;
  uint _w;
  long lVar27;
  long lVar28;
  int i_1;
  int iVar29;
  ulong uVar30;
  int local_168;
  undefined8 local_110;
  Mat weight_data_r2;
  Mat g0;
  Mat local_78;
  
  p_Var14 = this->_vptr_Convolution_x86[-3];
  _c = *(uint *)(p_Var14 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
  _w = *(int *)(p_Var14 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) *
       *(int *)(p_Var14 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
  uVar18 = (long)((ulong)(uint)((int)((long)*(int *)(p_Var14 + 0x14 +
                                                    (long)&(this->weight_data_int8).data) /
                                     (long)(int)_w) >> 0x1f) << 0x20 |
                 (long)*(int *)(p_Var14 + 0x14 + (long)&(this->weight_data_int8).data) /
                 (long)(int)_w & 0xffffffffU) / (long)(int)_c;
  if (opt->use_packing_layout == true) {
    uVar25 = 1;
    if ((uVar18 & 7) == 0) {
      uVar25 = 8;
    }
    uVar24 = (ulong)((uint)((_c & 3) == 0) * 3 + 1);
  }
  else {
    uVar25 = 1;
    uVar24 = 1;
  }
  iVar29 = (int)uVar25;
  iVar21 = (int)uVar18;
  local_168 = (int)uVar24;
  if ((iVar29 == 1) && (local_168 == 1)) {
    if ((((*(int *)(p_Var14 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3) &&
         (*(int *)(p_Var14 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
        ((opt->use_winograd_convolution != false &&
         ((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
          ((0xf < (int)_c && (*(int *)((long)&this->convolution_dilation1 + (long)p_Var14) == 1)))))
         ))) && (0xf < iVar21)) {
      Mat::create(&this->weight_data_3x3_winograd23_int8,0x10,iVar21,_c,2,(Allocator *)0x0);
      for (uVar25 = 0; uVar25 != _c; uVar25 = uVar25 + 1) {
        for (uVar24 = 0; uVar24 != (uVar18 & 0xffffffff); uVar24 = uVar24 + 1) {
          lVar27 = *(long *)(p_Var14 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data) +
                   (long)(iVar21 * 9 * (int)uVar25);
          lVar28 = uVar24 * 9;
          Mat::channel(&weight_data_r2,&this->weight_data_3x3_winograd23_int8,(int)uVar25);
          sVar15 = weight_data_r2.elemsize;
          pvVar22 = weight_data_r2.data;
          lVar17 = (long)weight_data_r2.w;
          Mat::~Mat(&weight_data_r2);
          cVar1 = *(char *)(lVar27 + lVar28);
          cVar2 = *(char *)(lVar27 + 1 + lVar28);
          cVar3 = *(char *)(lVar27 + 2 + lVar28);
          cVar4 = *(char *)(lVar27 + 3 + lVar28);
          cVar5 = *(char *)(lVar27 + 4 + lVar28);
          cVar6 = *(char *)(lVar27 + 5 + lVar28);
          cVar7 = *(char *)(lVar27 + 6 + lVar28);
          cVar8 = *(char *)(lVar27 + 7 + lVar28);
          cVar9 = *(char *)(lVar27 + 8 + lVar28);
          for (lVar28 = 4; lVar28 != 0x1c; lVar28 = lVar28 + 6) {
            sVar10 = *(short *)(&UNK_002db36c + lVar28);
            sVar11 = *(short *)(&UNK_002db36e + lVar28);
            sVar12 = *(short *)((long)&DAT_002db370 + lVar28);
            *(short *)((long)&local_110 + lVar28 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_110 + lVar28 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)&weight_data_r2.data + lVar28) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
          }
          pvVar22 = (void *)((long)pvVar22 + sVar15 * uVar24 * lVar17);
          for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
            sVar10 = *(short *)((long)&weight_data_r2.data + lVar28 * 6);
            uVar13 = *(undefined4 *)((long)&weight_data_r2.data + lVar28 * 6 + 2);
            puVar20 = &DAT_002db372;
            for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
              *(short *)((long)pvVar22 + lVar17 * 2) =
                   (short)((uint)*puVar20 >> 0x10) * (short)((uint)uVar13 >> 0x10) +
                   (short)*puVar20 * (short)uVar13 + *(short *)((long)puVar20 + -2) * sVar10;
              puVar20 = (undefined4 *)((long)puVar20 + 6);
            }
            pvVar22 = (void *)((long)pvVar22 + 8);
          }
        }
      }
    }
  }
  else {
    Mat::reshape(&weight_data_r2,
                 (Mat *)(p_Var14 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data),_w,
                 iVar21,_c,(Allocator *)0x0);
    this_00 = &this->weight_data_int8;
    Mat::create(this_00,_w,
                (int)((long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                     (long)iVar29),
                *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                        (long)&(this->weight_data_3x3_winograd63).data) / local_168,
                (ulong)(uint)(local_168 * iVar29),local_168 * iVar29,(Allocator *)0x0);
    if ((int)_w < 1) {
      _w = 0;
    }
    uVar26 = 0;
    local_110 = uVar18 & 0xffffffff;
    while (uVar18 = local_110, iVar23 = (int)uVar26,
          local_168 + -1 + iVar23 <
          *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                  (long)&(this->weight_data_3x3_winograd63).data)) {
      Mat::channel(&g0,this_00,(int)(uVar26 / uVar24));
      for (uVar18 = 0; (long)uVar18 < (long)((long)iVar21 - (ulong)(iVar29 - 1));
          uVar18 = uVar18 + uVar25) {
        pvVar22 = (void *)(((uVar18 & 0xffffffff) / uVar25) * (long)g0.w * g0.elemsize +
                          (long)g0.data);
        for (uVar26 = 0; uVar26 != _w; uVar26 = uVar26 + 1) {
          for (iVar19 = 0; iVar19 != local_168; iVar19 = iVar19 + 1) {
            for (uVar30 = 0; uVar25 != uVar30; uVar30 = uVar30 + 1) {
              Mat::channel(&local_78,&weight_data_r2,iVar19 + iVar23);
              pvVar16 = local_78.data;
              lVar28 = (long)local_78.w * (uVar18 + uVar30) * local_78.elemsize;
              Mat::~Mat(&local_78);
              *(undefined1 *)((long)pvVar22 + uVar30) =
                   *(undefined1 *)((long)pvVar16 + uVar26 + lVar28);
            }
            pvVar22 = (void *)((long)pvVar22 + uVar30);
          }
        }
      }
      Mat::~Mat(&g0);
      uVar26 = (ulong)(uint)(iVar23 + local_168);
    }
    Mat::~Mat(&weight_data_r2);
    if ((iVar29 == 8) && (local_168 == 4)) {
      p_Var14 = this->_vptr_Convolution_x86[-3];
      iVar21 = *(int *)(p_Var14 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if (((iVar21 == 1) &&
          (*(int *)(p_Var14 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
         (((((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)(p_Var14 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(int *)((long)&this->convolution_dilation1 + (long)p_Var14) == 1)) ||
          (((*(int *)(p_Var14 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
            (*(int *)(p_Var14 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           ((*(int *)(p_Var14 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 2 &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var14) == 2)))))))) {
        iVar29 = *(int *)(p_Var14 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar21 = 1;
        iVar23 = iVar21;
      }
      else {
        if (opt->use_sgemm_convolution != true) {
          return 0;
        }
        iVar29 = *(int *)(p_Var14 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar23 = *(int *)(p_Var14 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      }
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var14 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data),
                 this_00,(int)uVar18,iVar29,iVar21,iVar23);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
            //         conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_data_3x3_winograd23_int8, num_input, num_output, opt);
        }
        else
        {
            // TODO offline transform weight
        }

        return 0;
    }

    // src = kw-kh-inch-outch
    // dst = pa-pb-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_int8.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_int8.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                signed char* g00 = g0.row<signed char>(p / elempack);

                for (int k = 0; k < maxk; k++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const signed char* k00 = weight_data_r2.channel(q + j).row<const signed char>(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_data_int8, num_input, num_output, kernel_w, kernel_h);
        }
    }
#endif // __SSE2__

    return 0;
}